

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mediator.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Person *pPVar2;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int __fd;
  int in_R8D;
  PersonReference j;
  ChatRoom room;
  PersonReference m;
  PersonReference p;
  string local_108;
  undefined1 local_e8 [16];
  string local_d8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  string local_98;
  long *local_78 [2];
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  local_d8._M_dataplus._M_p = (pointer)0x0;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Peter","");
  ChatRoom::join((ChatRoom *)local_a8,(string *)(local_e8 + 0x10));
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Mark","");
  ChatRoom::join((ChatRoom *)local_b8,(string *)(local_e8 + 0x10));
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"John","");
  ChatRoom::join((ChatRoom *)local_e8,(string *)(local_e8 + 0x10));
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  pPVar2 = ChatRoom::PersonReference::operator->((PersonReference *)local_a8);
  paVar1 = &local_108.field_2;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Hi everyone!","");
  __fd = (int)&local_108;
  Person::send(pPVar2,__fd,__buf,in_RCX,in_R8D);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = ChatRoom::PersonReference::operator->((PersonReference *)local_b8);
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Hi everyone!","");
  Person::send(pPVar2,__fd,__buf_00,in_RCX,in_R8D);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = ChatRoom::PersonReference::operator->((PersonReference *)local_e8);
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Hi everyone!","");
  Person::send(pPVar2,__fd,__buf_01,in_RCX,in_R8D);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  pPVar2 = ChatRoom::PersonReference::operator->((PersonReference *)local_e8);
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Peter","");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_a8 + 0x10),"Yo Pete!","");
  Person::private_message(pPVar2,&local_108,(string *)(local_a8 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
  }
  std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>::~vector
            ((vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_> *)
             (local_e8 + 0x10));
  return 0;
}

Assistant:

int main()
{
	ChatRoom room;
	auto p{room.join("Peter")};
	auto m{room.join("Mark")};
	auto j{room.join("John")};
	p->send("Hi everyone!");
	m->send("Hi everyone!");
	j->send("Hi everyone!");
	j->private_message("Peter", "Yo Pete!");

	return 0;
}